

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ConvolutionParameter::ConvolutionParameter(ConvolutionParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ConvolutionParameter_007603d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->pad_).current_size_ = 0;
  (this->pad_).total_size_ = 0;
  (this->pad_).rep_ = (Rep *)0x0;
  (this->kernel_size_).current_size_ = 0;
  (this->kernel_size_).total_size_ = 0;
  (this->kernel_size_).rep_ = (Rep *)0x0;
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  (this->dilation_).current_size_ = 0;
  (this->dilation_).total_size_ = 0;
  (this->dilation_).rep_ = (Rep *)0x0;
  if (this != (ConvolutionParameter *)&_ConvolutionParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  this->weight_filler_ = (FillerParameter *)0x0;
  this->bias_filler_ = (FillerParameter *)0x0;
  this->num_output_ = 0;
  this->pad_h_ = 0;
  this->pad_w_ = 0;
  this->kernel_h_ = 0;
  this->kernel_w_ = 0;
  this->stride_h_ = 0;
  this->stride_w_ = 0;
  this->engine_ = 0;
  this->force_nd_im2col_ = false;
  this->axis_ = 1;
  this->bias_term_ = true;
  this->group_ = 1;
  return;
}

Assistant:

ConvolutionParameter::ConvolutionParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.ConvolutionParameter)
}